

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>,_bool>
 __thiscall
ArgumentParser::KeywordActionMap::Emplace
          (KeywordActionMap *this,string_view name,KeywordAction *action)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  pointer ppVar2;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>,_bool>
  pVar3;
  bool local_a9;
  const_iterator local_a8;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  local_a0 [3];
  bool local_81;
  KeywordActionMap *local_80;
  size_t local_78;
  size_t local_70;
  char *local_68;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  local_60 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  *local_50;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
  *local_48;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  local_40;
  __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
  it;
  KeywordAction *action_local;
  KeywordActionMap *this_local;
  string_view name_local;
  undefined1 local_10;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (KeywordActionMap *)name._M_len;
  it._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)action;
  local_48 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
              *)std::
                vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                ::begin(&this->
                         super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                       );
  local_50 = (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
              *)std::
                vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                ::end(&this->
                       super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                     );
  local_40 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>>,std::basic_string_view<char,std::char_traits<char>>,ArgumentParser::KeywordActionMap::Emplace(std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>)::__0>
                       (local_48,local_50,&this_local);
  local_60[0]._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)std::
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
          ::end(&this->
                 super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               );
  bVar1 = __gnu_cxx::operator!=(&local_40,local_60);
  if (bVar1) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>_>
             ::operator->(&local_40);
    local_70 = (ppVar2->first)._M_len;
    local_68 = (ppVar2->first)._M_str;
    local_80 = this_local;
    local_78 = name_local._M_len;
    __y._M_str = (char *)name_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar1 = std::operator==(ppVar2->first,__y);
    if (bVar1) {
      local_81 = false;
      pVar3 = std::
              make_pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>>const&,bool>
                        (&local_40,&local_81);
      local_10 = pVar3.second;
      goto LAB_0066c815;
    }
  }
  __gnu_cxx::
  __normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>const*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>>
  ::
  __normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>*>
            ((__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>const*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>>
              *)&local_a8,&local_40);
  local_a0[0]._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)std::
          vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>
          ::
          emplace<std::basic_string_view<char,std::char_traits<char>>&,std::function<void(ArgumentParser::Instance&)>>
                    ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>
                      *)this,local_a8,
                     (basic_string_view<char,_std::char_traits<char>_> *)&this_local,action);
  local_a9 = true;
  pVar3 = std::
          make_pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::function<void(ArgumentParser::Instance&)>>>>>,bool>
                    (local_a0,&local_a9);
  local_10 = pVar3.second;
LAB_0066c815:
  name_local._M_str = (char *)pVar3.first._M_current;
  pVar3.second = (bool)local_10;
  pVar3.first._M_current =
       (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>
        *)name_local._M_str;
  return pVar3;
}

Assistant:

auto KeywordActionMap::Emplace(cm::string_view name, KeywordAction action)
  -> std::pair<iterator, bool>
{
  auto const it =
    std::lower_bound(this->begin(), this->end(), name,
                     [](value_type const& elem, cm::string_view const& k) {
                       return elem.first < k;
                     });
  return (it != this->end() && it->first == name)
    ? std::make_pair(it, false)
    : std::make_pair(this->emplace(it, name, std::move(action)), true);
}